

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optTyped_otherTypeMoveAssignmentEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>
::~optTyped_otherTypeMoveAssignmentEmptyForNotEmpty_Test
          (optTyped_otherTypeMoveAssignmentEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeMoveAssignmentEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2{this->value_1};
  o2 = std::move(o1);
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}